

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O3

vaddr arm_adjust_watchpoint_address_arm(CPUState *cs,vaddr addr,int len)

{
  if (((ulong)cs[1].tb_jmp_cache[0x454] & 0x80) != 0) {
    if (len == 2) {
      addr = addr ^ 2;
    }
    else if (len == 1) {
      return addr ^ 3;
    }
  }
  return addr;
}

Assistant:

vaddr arm_adjust_watchpoint_address(CPUState *cs, vaddr addr, int len)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;

    /*
     * In BE32 system mode, target memory is stored byteswapped (on a
     * little-endian host system), and by the time we reach here (via an
     * opcode helper) the addresses of subword accesses have been adjusted
     * to account for that, which means that watchpoints will not match.
     * Undo the adjustment here.
     */
    if (arm_sctlr_b(env)) {
        if (len == 1) {
            addr ^= 3;
        } else if (len == 2) {
            addr ^= 2;
        }
    }

    return addr;
}